

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O0

bool __thiscall wasm::SCCs<IntIt,_GraphSCCs>::stepToNextGroup(SCCs<IntIt,_GraphSCCs> *this)

{
  bool bVar1;
  pointer ppVar2;
  uint *puVar3;
  mapped_type *pmVar4;
  unsigned_long *puVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false,_false>,_bool>
  pVar6;
  byte local_f1;
  _Optional_payload_base<unsigned_int> local_e8;
  size_t *local_e0;
  size_t *parentLowlink_1;
  mapped_type *info;
  size_t *parentLowlink;
  ElementInfo *info_1;
  _Optional_payload_base<unsigned_int> local_b8;
  type_conflict2 *local_b0;
  type_conflict2 *inserted;
  type *it;
  undefined1 local_98;
  ElementInfo local_90;
  pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo> local_78;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false,_false>,_bool>
  local_58;
  size_type local_48;
  size_type newIndex;
  T *item;
  value_type *work;
  value_type local_28;
  SCCs<IntIt,_GraphSCCs> *local_18;
  SCCs<IntIt,_GraphSCCs> *this_local;
  
  local_18 = this;
  do {
    bVar1 = IntIt::operator!=(&this->inputIt,&this->inputEnd);
    local_f1 = 1;
    if (!bVar1) {
      bVar1 = std::
              vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
              ::empty(&this->workStack);
      local_f1 = bVar1 ^ 0xff;
    }
    if ((local_f1 & 1) == 0) {
      return false;
    }
    bVar1 = std::
            vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
            ::empty(&this->workStack);
    if (bVar1) {
      work._4_4_ = IntIt::operator++(&this->inputIt,0);
      local_28.item = IntIt::operator*((IntIt *)((long)&work + 4));
      std::optional<unsigned_int>::optional(&local_28.parent);
      local_28.processedChildren = false;
      std::
      vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
      ::push_back(&this->workStack,&local_28);
    }
    while (bVar1 = std::
                   vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                   ::empty(&this->workStack), ((bVar1 ^ 0xffU) & 1) != 0) {
      newIndex = (size_type)
                 std::
                 vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                 ::back(&this->workStack);
      item = (T *)newIndex;
      if ((((reference)newIndex)->processedChildren & 1U) == 0) {
        local_90.index =
             std::
             unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
             ::size(&this->elementInfo);
        local_90.onStack = true;
        local_90.lowlink = local_90.index;
        local_48 = local_90.index;
        std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>::
        pair<unsigned_int_&,_true>(&local_78,(uint *)newIndex,&local_90);
        pVar6 = std::
                unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
                ::insert(&this->elementInfo,&local_78);
        it = (type *)pVar6.first.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                     ._M_cur;
        local_98 = pVar6.second;
        local_58.first.
        super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                   )(_Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                     )it;
        local_58.second = (bool)local_98;
        inserted = (type_conflict2 *)
                   std::
                   get<0ul,std::__detail::_Node_iterator<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>,false,false>,bool>
                             (&local_58);
        local_b0 = std::
                   get<1ul,std::__detail::_Node_iterator<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>,false,false>,bool>
                             (&local_58);
        if ((*local_b0 & 1U) == 0) {
          ppVar2 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false,_false>
                                 *)inserted);
          parentLowlink = &(ppVar2->second).index;
          if (((ppVar2->second).onStack & 1U) != 0) {
            bVar1 = std::optional::operator_cast_to_bool((optional *)(item + 1));
            if (!bVar1) {
              __assert_fail("work.parent",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                            ,0x6e,
                            "bool wasm::SCCs<IntIt, GraphSCCs>::stepToNextGroup() [It = IntIt, Class = GraphSCCs]"
                           );
            }
            puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)(item + 1));
            pmVar4 = std::
                     unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
                     ::operator[](&this->elementInfo,puVar3);
            info = (mapped_type *)&pmVar4->lowlink;
            puVar5 = std::min<unsigned_long>((unsigned_long *)info,parentLowlink);
            info->index = *puVar5;
          }
          std::
          vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
          ::pop_back(&this->workStack);
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->stack,(value_type_conflict2 *)newIndex);
          *(undefined1 *)(item + 3) = 1;
          std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                    ((optional<unsigned_int> *)&local_b8,(uint *)newIndex);
          (this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> = local_b8;
          GraphSCCs::pushChildren((GraphSCCs *)this,*(uint *)newIndex);
          std::optional<unsigned_int>::operator=(&this->currParent);
        }
      }
      else {
        parentLowlink_1 =
             &std::
              unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
              ::operator[](&this->elementInfo,(key_type *)newIndex)->index;
        bVar1 = std::optional::operator_cast_to_bool((optional *)(item + 1));
        if (bVar1) {
          puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)(item + 1));
          pmVar4 = std::
                   unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
                   ::operator[](&this->elementInfo,puVar3);
          local_e0 = &pmVar4->lowlink;
          puVar5 = std::min<unsigned_long>(local_e0,parentLowlink_1 + 1);
          *local_e0 = *puVar5;
        }
        if (*parentLowlink_1 == parentLowlink_1[1]) {
          std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                    ((optional<unsigned_int> *)&local_e8,(uint *)newIndex);
          (this->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> = local_e8;
          std::
          vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
          ::pop_back(&this->workStack);
          return true;
        }
        std::
        vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
        ::pop_back(&this->workStack);
      }
    }
  } while( true );
}

Assistant:

bool stepToNextGroup() {
    while (inputIt != inputEnd || !workStack.empty()) {
      if (workStack.empty()) {
        workStack.push_back({*inputIt++});
      }
      while (!workStack.empty()) {
        auto& work = workStack.back();
        auto& item = work.item;

        if (!work.processedChildren) {
          auto newIndex = elementInfo.size();
          auto [it, inserted] =
            elementInfo.insert({item, {newIndex, newIndex, true}});
          if (inserted) {
            // This is a new item we have never seen before. We have already
            // initialized its associated data.
            stack.push_back(item);

            // Leave the element on the work stack because we will have to do
            // more work after we have finished processing its children.
            work.processedChildren = true;
            currParent = item;
            static_cast<Class*>(this)->pushChildren(item);
            currParent = std::nullopt;
            // Process the pushed children first; we will come back to this item
            // later.
            continue;
          }

          auto& info = it->second;
          if (info.onStack) {
            assert(work.parent);
            // Item is already in the current SCC. Update the parent's lowlink
            // if this child has a smaller index than we have seen so far.
            auto& parentLowlink = elementInfo[*work.parent].lowlink;
            parentLowlink = std::min(parentLowlink, info.index);
          } else {
            // Item is in an SCC we have already processed, so ignore it
            // entirely.
          }
          // Do not recurse for this item we have seen before. We are done with
          // it.
          workStack.pop_back();
          continue;
        }

        // We have finished processing the children for the current element, so
        // we know its final lowlink value. Use it to potentially update the
        // parent's lowlink value.
        auto& info = elementInfo[item];
        if (work.parent) {
          auto& parentLowlink = elementInfo[*work.parent].lowlink;
          parentLowlink = std::min(parentLowlink, info.lowlink);
        }

        if (info.index == info.lowlink) {
          // This element reaches and is reachable by all shallower elements in
          // the stack (otherwise they would have already been popped) and does
          // not itself reach any deeper elements, so we have found an SCC and
          // the current item is its root.
          currRoot = item;
          workStack.pop_back();
          return true;
        }
        workStack.pop_back();
      }
    }
    // We are at the end.
    return false;
  }